

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexWriter.cpp
# Opt level: O3

void __thiscall
Ptex::v2_2::PtexWriterBase::addMetaData
          (PtexWriterBase *this,char *key,MetaDataType t,void *value,int size)

{
  ostream *poVar1;
  pointer pMVar2;
  char *pcVar3;
  size_t sVar4;
  iterator iVar5;
  _Rb_tree_color *p_Var6;
  _Rb_tree_color _Var7;
  ulong uVar8;
  stringstream str;
  long *local_1d8 [2];
  long local_1c8 [2];
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  sVar4 = strlen(key);
  if (sVar4 < 0x100) {
    if (size < 1) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      poVar1 = (ostream *)(local_1b8 + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"PtexWriter error: meta data size <= 0 for \"",0x2b);
      if (key == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(local_1a8[0]._M_allocated_capacity - 0x18) +
                        (int)poVar1);
      }
      else {
        sVar4 = strlen(key);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,key,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_assign((string *)&this->_error);
      this->_ok = false;
      if (local_1d8[0] != local_1c8) {
        operator_delete(local_1d8[0],local_1c8[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,key,(allocator<char> *)local_1d8);
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::find(&(this->_metamap)._M_t,(key_type *)local_1b8);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)iVar5._M_node == &(this->_metamap)._M_t._M_impl.super__Rb_tree_header) {
      uVar8 = (long)(this->_metadata).
                    super__Vector_base<Ptex::v2_2::PtexWriterBase::MetaEntry,_std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->_metadata).
                    super__Vector_base<Ptex::v2_2::PtexWriterBase::MetaEntry,_std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      std::
      vector<Ptex::v2_2::PtexWriterBase::MetaEntry,_std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry>_>
      ::resize(&this->_metadata,(long)(uVar8 * 0x4000000 + 0x100000000) >> 0x20);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b8,key,(allocator<char> *)local_1d8);
      p_Var6 = (_Rb_tree_color *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&this->_metamap,(key_type *)local_1b8);
      _Var7 = (_Rb_tree_color)(uVar8 >> 6);
      *p_Var6 = _Var7;
      if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
        operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
      }
    }
    else {
      _Var7 = iVar5._M_node[2]._M_color;
    }
    pMVar2 = (this->_metadata).
             super__Vector_base<Ptex::v2_2::PtexWriterBase::MetaEntry,_std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar3 = (char *)pMVar2[(int)_Var7].key._M_string_length;
    strlen(key);
    std::__cxx11::string::_M_replace((ulong)(pMVar2 + (int)_Var7),0,pcVar3,(ulong)key);
    pMVar2[(int)_Var7].datatype = t;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&pMVar2[(int)_Var7].data,(long)size);
    memcpy(pMVar2[(int)_Var7].data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
           ._M_impl.super__Vector_impl_data._M_start,value,(long)size);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    poVar1 = (ostream *)(local_1b8 + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"PtexWriter error: meta data key too long (max=255) \"",0x34);
    if (key == (char *)0x0) {
      std::ios::clear((int)poVar1 + (int)*(undefined8 *)(local_1a8[0]._M_allocated_capacity - 0x18))
      ;
    }
    else {
      sVar4 = strlen(key);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,key,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_assign((string *)&this->_error);
    this->_ok = false;
    if (local_1d8[0] != local_1c8) {
      operator_delete(local_1d8[0],local_1c8[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

void PtexWriterBase::addMetaData(const char* key, MetaDataType t,
                                 const void* value, int size)
{
    if (strlen(key) > 255) {
        std::stringstream str;
        str << "PtexWriter error: meta data key too long (max=255) \"" << key << "\"";
        setError(str.str());
        return;
    }
    if (size <= 0) {
        std::stringstream str;
        str << "PtexWriter error: meta data size <= 0 for \"" << key << "\"";
        setError(str.str());
    }
    std::map<std::string,int>::iterator iter = _metamap.find(key);
    int index;
    if (iter != _metamap.end()) {
        // see if we already have this entry - if so, overwrite it
        index = iter->second;
    }
    else {
        // allocate a new entry
        index = (int)_metadata.size();
        _metadata.resize(index+1);
        _metamap[key] = index;
    }
    MetaEntry& m = _metadata[index];
    m.key = key;
    m.datatype = t;
    m.data.resize(size);
    memcpy(&m.data[0], value, size);
}